

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::CommandReporter::getCommandLine
          (CommandReporter *this,string *received,string *approved)

{
  long *plVar1;
  long in_RSI;
  string *in_RDI;
  string *in_stack_000001e8;
  string *in_stack_000001f0;
  CommandReporter *in_stack_000001f8;
  string local_40 [64];
  
  plVar1 = *(long **)(in_RSI + 0x48);
  assembleFullCommand(in_stack_000001f8,in_stack_000001f0,in_stack_000001e8);
  (**(code **)(*plVar1 + 0x18))(in_RDI,plVar1,local_40);
  ::std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

std::string CommandReporter::getCommandLine(const std::string& received,
                                                const std::string& approved) const
    {
        return l->getCommandLine(assembleFullCommand(received, approved));
    }